

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QString_&>,_QString_&>,_const_char_(&)[10]>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QString_&>,_QString_&>,_const_char_(&)[10]>
          *this)

{
  QChar *__dest;
  QString *pQVar1;
  long lVar2;
  long lVar3;
  char16_t *pcVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  iterator d;
  QChar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (((this->a).b)->d).size + (((this->a).a.a)->d).size + (((this->a).a.b)->d).size + 9;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar3,Uninitialized);
  __dest = (QChar *)(__return_storage_ptr__->d).ptr;
  pQVar1 = (this->a).a.a;
  lVar2 = (pQVar1->d).size;
  local_40 = __dest;
  if (lVar2 != 0) {
    pcVar4 = (pQVar1->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar4,lVar2 * 2);
  }
  local_40 = local_40 + lVar2;
  pQVar1 = (this->a).a.b;
  lVar2 = (pQVar1->d).size;
  if (lVar2 != 0) {
    pcVar4 = (pQVar1->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(local_40,pcVar4,lVar2 * 2);
  }
  local_40 = local_40 + lVar2;
  pQVar1 = (this->a).b;
  lVar2 = (pQVar1->d).size;
  if (lVar2 != 0) {
    pcVar4 = (pQVar1->d).ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(local_40,pcVar4,lVar2 * 2);
  }
  local_40 = local_40 + lVar2;
  QVar5.m_data = *this->b;
  QVar5.m_size = 9;
  QAbstractConcatenable::convertFromUtf8(QVar5,&local_40);
  if (lVar3 != (long)local_40 - (long)__dest >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }